

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O1

int append_str(CharBuff *buff,char *c)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = 0;
  if (c == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    do {
      uVar5 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (c[uVar5] != '\0');
  }
  bVar6 = uVar5 == 0;
  if ((!bVar6) && (iVar3 = sbuff_write(buff,*c), iVar3 != 0)) {
    uVar1 = 1;
    do {
      uVar4 = uVar1;
      if (uVar5 == uVar4) break;
      iVar3 = sbuff_write(buff,c[uVar4]);
      uVar1 = uVar4 + 1;
    } while (iVar3 != 0);
    bVar6 = uVar5 <= uVar4;
  }
  return (int)bVar6;
}

Assistant:

int append_str(CharBuff* buff, const char *c){
    unsigned long len = str_len_(c);
    for (int i = 0; i < len; ++i) {
        if (sbuff_write(buff, c[i])  == 0)return false;
    }
    return true;
}